

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PosixSerialPort.cpp
# Opt level: O2

void __thiscall PosixSerialPort::~PosixSerialPort(PosixSerialPort *this)

{
  (this->super_SerialPort)._vptr_SerialPort = (_func_int **)&PTR__PosixSerialPort_00117c88;
  if (-1 < this->_devfd) {
    ::close(this->_devfd);
  }
  SerialPort::~SerialPort(&this->super_SerialPort);
  return;
}

Assistant:

PosixSerialPort::~PosixSerialPort()
{
    if (_devfd >= 0)
        ::close(_devfd);
}